

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

char * mg_get_mime_type(char *path,char *default_mime_type)

{
  int iVar1;
  size_t sVar2;
  size_t path_len;
  size_t i;
  char *ext;
  char *default_mime_type_local;
  char *path_local;
  
  sVar2 = strlen(path);
  path_len = 0;
  while( true ) {
    if (static_builtin_mime_types[path_len].extension == (char *)0x0) {
      return default_mime_type;
    }
    if ((static_builtin_mime_types[path_len].ext_len < sVar2) &&
       (iVar1 = mg_strcasecmp(path + (sVar2 - static_builtin_mime_types[path_len].ext_len),
                              static_builtin_mime_types[path_len].extension), iVar1 == 0)) break;
    path_len = path_len + 1;
  }
  return static_builtin_mime_types[path_len].mime_type;
}

Assistant:

const char *mg_get_mime_type(const char *path, const char *default_mime_type) {
  const char *ext;
  size_t i, path_len;

  path_len = strlen(path);

  for (i = 0; static_builtin_mime_types[i].extension != NULL; i++) {
    ext = path + (path_len - static_builtin_mime_types[i].ext_len);
    if (path_len > static_builtin_mime_types[i].ext_len &&
        mg_strcasecmp(ext, static_builtin_mime_types[i].extension) == 0) {
      return static_builtin_mime_types[i].mime_type;
    }
  }

  return default_mime_type;
}